

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O1

SDKJsonResult * __thiscall
tonk::SDKSocket::Create(SDKJsonResult *__return_storage_ptr__,SDKSocket *this)

{
  char *pcVar1;
  TonkResult TVar2;
  TonkSocketConfig config;
  TonkJson json;
  TonkSocketConfig local_4a8;
  TonkJson local_428;
  
  if (this->MySocket != (TonkSocket)0x0) {
    if (fp_tonk_socket_destroy != (fp_tonk_socket_destroy_t)0x0) {
      (*fp_tonk_socket_destroy)(this->MySocket,1);
    }
    this->MySocket = (TonkSocket)0x0;
  }
  local_4a8.WorkerCount = (this->Config).WorkerCount;
  local_4a8.UDPSendBufferSizeBytes = (this->Config).UDPSendBufferSizeBytes;
  local_4a8.UDPRecvBufferSizeBytes = (this->Config).UDPRecvBufferSizeBytes;
  local_4a8.UDPListenPort = (this->Config).UDPListenPort;
  local_4a8.MaximumClients = (this->Config).MaximumClients;
  local_4a8.MaximumClientsPerIP = (this->Config).MaximumClientsPerIP;
  local_4a8.MinuteFloodThresh = (this->Config).MinuteFloodThresh;
  local_4a8.TimerIntervalUsec = (this->Config).TimerIntervalUsec;
  local_4a8.NoDataTimeoutUsec = (this->Config).NoDataTimeoutUsec;
  local_4a8.UDPConnectIntervalUsec = (this->Config).UDPConnectIntervalUsec;
  local_4a8.ConnectionTimeoutUsec = (this->Config).ConnectionTimeoutUsec;
  local_4a8._60_4_ = *(undefined4 *)&(this->Config).field_0x3c;
  local_4a8.InterfaceAddress = (this->Config).InterfaceAddress;
  local_4a8.BandwidthLimitBPS = (this->Config).BandwidthLimitBPS;
  local_4a8.Flags = (this->Config).Flags;
  local_4a8.SendToAppContextPtr = (this->Config).SendToAppContextPtr;
  local_4a8.SendToHook = (this->Config).SendToHook;
  local_4a8._4_4_ = SUB84((ulong)*(undefined8 *)&this->Config >> 0x20,0);
  local_4a8.Version = 9;
  local_4a8.OnP2PConnectionStart = Create::anon_class_1_0_00000001::__invoke;
  local_4a8.OnIncomingConnection = Create::anon_class_1_0_00000001::__invoke;
  local_4a8.OnAdvertisement = Create::anon_class_1_0_00000001::__invoke;
  local_4a8.AppContextPtr = this;
  TVar2 = tonk_socket_create(&local_4a8,&this->MySocket,&local_428);
  (__return_storage_ptr__->super_SDKResult).Result = Tonk_Success;
  (__return_storage_ptr__->ErrorJson)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ErrorJson).field_2;
  (__return_storage_ptr__->ErrorJson)._M_string_length = 0;
  (__return_storage_ptr__->ErrorJson).field_2._M_local_buf[0] = '\0';
  if (TVar2 != Tonk_Success) {
    (__return_storage_ptr__->super_SDKResult).Result = TVar2;
    pcVar1 = (char *)(__return_storage_ptr__->ErrorJson)._M_string_length;
    strlen(local_428.JsonString);
    std::__cxx11::string::_M_replace
              ((ulong)&__return_storage_ptr__->ErrorJson,0,pcVar1,(ulong)&local_428);
  }
  return __return_storage_ptr__;
}

Assistant:

SDKJsonResult SDKSocket::Create()
{
    BlockingDestroy();

    TonkSocketConfig config = Config;

    // Override the following members:
    config.AppContextPtr = reinterpret_cast<TonkAppContextPtr>(this);
    config.Version = TONK_VERSION;
    config.OnP2PConnectionStart = [](
        TonkAppContextPtr context,
        TonkConnection connection,
        const TonkAddress* address,
        TonkConnectionConfig* configOut) -> uint32_t
    {
        SDKSocket* thiz = (SDKSocket*)context;
        SDKConnection* sdkConnection = thiz->OnP2PConnectionStart(*address);
        if (!sdkConnection) {
            return TONK_DENY_CONNECTION;
        }

        sdkConnection->MyConnection = connection;
        // Hold a self-reference if connection is started
        sdkConnection->SetSelfReference();

        *configOut = MakeConnectionConfig(sdkConnection);
        return TONK_ACCEPT_CONNECTION;
    };
    config.OnIncomingConnection = [](
        TonkAppContextPtr context,
        TonkConnection connection,
        const TonkAddress* address,
        TonkConnectionConfig* configOut) -> uint32_t
    {
        SDKSocket* thiz = (SDKSocket*)context;
        SDKConnection* sdkConnection = thiz->OnIncomingConnection(*address);
        if (!sdkConnection) {
            return TONK_DENY_CONNECTION;
        }

        sdkConnection->MyConnection = connection;
        // Hold a self-reference if connection is started
        sdkConnection->SelfReference = sdkConnection->shared_from_this();

        *configOut = MakeConnectionConfig(sdkConnection);
        return TONK_ACCEPT_CONNECTION;
    };
    config.OnAdvertisement = [](
        TonkAppContextPtr context,
        TonkSocket /*tonkSocket*/,
        const char* ipString,
        uint16_t port,
        uint8_t* data,
        uint32_t bytes)
    {
        SDKSocket* thiz = (SDKSocket*)context;
        thiz->OnAdvertisement(ipString, port, data, bytes);
    };

    TonkJson json;
    TonkResult result = tonk_socket_create(&config, &MySocket, &json);

    SDKJsonResult error;
    if (TONK_FAILED(result))
    {
        error.Result = result;
        error.ErrorJson = json.JsonString;
    }
    return error;
}